

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

void ImageAlphaClear(Image *image,Color color,float threshold)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  unsigned_short uVar6;
  int i_5;
  int i;
  int i_2;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    iVar1 = image->format;
    if (0xd < iVar1) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    if (iVar1 - 2U < 0xc) {
      uVar3 = (uint)color >> 8;
      uVar4 = (uint)color >> 0x10;
      uVar5 = (uint)color >> 0x18;
      switch(iVar1) {
      case 2:
        for (lVar7 = 1; lVar7 < image->width * image->height * 2; lVar7 = lVar7 + 2) {
          if (*(byte *)((long)image->data + lVar7) <= (byte)(int)(threshold * 255.0)) {
            *(uchar *)((long)image->data + lVar7 + -1) = color.r;
            *(uchar *)((long)image->data + lVar7) = color.a;
          }
        }
        break;
      case 5:
        fVar11 = roundf((float)((uint)color & 0xff) * 31.0);
        fVar8 = roundf((float)(uVar3 & 0xff) * 31.0);
        fVar9 = roundf((float)(uVar4 & 0xff) * 31.0);
        for (lVar7 = 0; lVar7 < (long)image->height * (long)image->width; lVar7 = lVar7 + 1) {
          if ((*(ushort *)((long)image->data + lVar7 * 2) & 1) <= (ushort)(0.5 <= threshold)) {
            *(ushort *)((long)image->data + lVar7 * 2) =
                 ((ushort)(int)fVar9 & 0xff) * 2 |
                 (ushort)(((int)fVar8 & 0xffU) << 6) |
                 (ushort)((int)fVar11 << 0xb) | color._2_2_ >> 0xf;
          }
        }
        break;
      case 6:
        fVar11 = roundf((float)((uint)color & 0xff) * 15.0);
        fVar8 = roundf((float)(uVar3 & 0xff) * 15.0);
        fVar9 = roundf((float)(uVar4 & 0xff) * 15.0);
        fVar10 = roundf((float)uVar5 * 15.0);
        for (lVar7 = 0; lVar7 < (long)image->height * (long)image->width; lVar7 = lVar7 + 1) {
          if ((*(ushort *)((long)image->data + lVar7 * 2) & 0xf) <=
              ((ushort)(int)(threshold * 15.0) & 0xff)) {
            *(ushort *)((long)image->data + lVar7 * 2) =
                 (ushort)(int)fVar10 & 0xff | (ushort)((int)fVar11 << 0xc) |
                 (ushort)((int)fVar8 << 8) | (ushort)(((int)fVar9 & 0xffU) << 4);
          }
        }
        break;
      case 7:
        for (lVar7 = 3; lVar7 < image->width * image->height * 4; lVar7 = lVar7 + 4) {
          if (*(byte *)((long)image->data + lVar7) <= (byte)(int)(threshold * 255.0)) {
            *(uchar *)((long)image->data + lVar7 + -3) = color.r;
            *(uchar *)((long)image->data + lVar7 + -2) = color.g;
            *(uchar *)((long)image->data + lVar7 + -1) = color.b;
            *(uchar *)((long)image->data + lVar7) = color.a;
          }
        }
        break;
      case 10:
        for (lVar7 = 3; lVar7 < image->width * image->height * 4; lVar7 = lVar7 + 4) {
          if (*(float *)((long)image->data + lVar7 * 4) <= threshold) {
            *(float *)((long)image->data + lVar7 * 4 + -0xc) = (float)((uint)color & 0xff) / 255.0;
            *(float *)((long)image->data + lVar7 * 4 + -8) = (float)(uVar3 & 0xff) / 255.0;
            *(float *)((long)image->data + lVar7 * 4 + -4) = (float)(uVar4 & 0xff) / 255.0;
            *(float *)((long)image->data + lVar7 * 4) = (float)uVar5 / 255.0;
          }
        }
        break;
      case 0xd:
        for (lVar7 = 3; lVar7 < image->width * image->height * 4; lVar7 = lVar7 + 4) {
          pvVar2 = image->data;
          fVar11 = HalfToFloat(*(unsigned_short *)((long)pvVar2 + lVar7 * 2));
          if (fVar11 <= threshold) {
            uVar6 = FloatToHalf((float)((uint)color & 0xff) / 255.0);
            *(unsigned_short *)((long)pvVar2 + lVar7 * 2 + -6) = uVar6;
            uVar6 = FloatToHalf((float)(uVar3 & 0xff) / 255.0);
            *(unsigned_short *)((long)image->data + lVar7 * 2 + -4) = uVar6;
            uVar6 = FloatToHalf((float)(uVar4 & 0xff) / 255.0);
            *(unsigned_short *)((long)image->data + lVar7 * 2 + -2) = uVar6;
            uVar6 = FloatToHalf((float)uVar5 / 255.0);
            *(unsigned_short *)((long)image->data + lVar7 * 2) = uVar6;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ImageAlphaClear(Image *image, Color color, float threshold)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        switch (image->format)
        {
            case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
            {
                unsigned char thresholdValue = (unsigned char)(threshold*255.0f);
                for (int i = 1; i < image->width*image->height*2; i += 2)
                {
                    if (((unsigned char *)image->data)[i] <= thresholdValue)
                    {
                        ((unsigned char *)image->data)[i - 1] = color.r;
                        ((unsigned char *)image->data)[i] = color.a;
                    }
                }
            } break;
            case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
            {
                unsigned char thresholdValue = ((threshold < 0.5f)? 0 : 1);

                unsigned char r = (unsigned char)(round((float)color.r*31.0f));
                unsigned char g = (unsigned char)(round((float)color.g*31.0f));
                unsigned char b = (unsigned char)(round((float)color.b*31.0f));
                unsigned char a = (color.a < 128)? 0 : 1;

                for (int i = 0; i < image->width*image->height; i++)
                {
                    if ((((unsigned short *)image->data)[i] & 0b0000000000000001) <= thresholdValue)
                    {
                        ((unsigned short *)image->data)[i] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;
                    }
                }
            } break;
            case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
            {
                unsigned char thresholdValue = (unsigned char)(threshold*15.0f);

                unsigned char r = (unsigned char)(round((float)color.r*15.0f));
                unsigned char g = (unsigned char)(round((float)color.g*15.0f));
                unsigned char b = (unsigned char)(round((float)color.b*15.0f));
                unsigned char a = (unsigned char)(round((float)color.a*15.0f));

                for (int i = 0; i < image->width*image->height; i++)
                {
                    if ((((unsigned short *)image->data)[i] & 0x000f) <= thresholdValue)
                    {
                        ((unsigned short *)image->data)[i] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;
                    }
                }
            } break;
            case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
            {
                unsigned char thresholdValue = (unsigned char)(threshold*255.0f);
                for (int i = 3; i < image->width*image->height*4; i += 4)
                {
                    if (((unsigned char *)image->data)[i] <= thresholdValue)
                    {
                        ((unsigned char *)image->data)[i - 3] = color.r;
                        ((unsigned char *)image->data)[i - 2] = color.g;
                        ((unsigned char *)image->data)[i - 1] = color.b;
                        ((unsigned char *)image->data)[i] = color.a;
                    }
                }
            } break;
            case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
            {
                for (int i = 3; i < image->width*image->height*4; i += 4)
                {
                    if (((float *)image->data)[i] <= threshold)
                    {
                        ((float *)image->data)[i - 3] = (float)color.r/255.0f;
                        ((float *)image->data)[i - 2] = (float)color.g/255.0f;
                        ((float *)image->data)[i - 1] = (float)color.b/255.0f;
                        ((float *)image->data)[i] = (float)color.a/255.0f;
                    }
                }
            } break;
            case PIXELFORMAT_UNCOMPRESSED_R16G16B16A16:
            {
                for (int i = 3; i < image->width*image->height*4; i += 4)
                {
                    if (HalfToFloat(((unsigned short *)image->data)[i]) <= threshold)
                    {
                        ((unsigned short *)image->data)[i - 3] = FloatToHalf((float)color.r/255.0f);
                        ((unsigned short *)image->data)[i - 2] = FloatToHalf((float)color.g/255.0f);
                        ((unsigned short *)image->data)[i - 1] = FloatToHalf((float)color.b/255.0f);
                        ((unsigned short *)image->data)[i] = FloatToHalf((float)color.a/255.0f);
                    }
                }
            } break;
            default: break;
        }
    }
}